

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> * __thiscall
el::base::TypedConfigurations::unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
          (TypedConfigurations *this,Level level,
          map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
          *confMap,char *confName)

{
  bool bVar1;
  iterator this_00;
  iterator __k;
  pointer ppVar2;
  iterator it;
  map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *local_8;
  
  this_00 = utils::std::
            map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
            ::find(in_stack_ffffffffffffffa8,(key_type *)0x279ae6);
  __k = utils::std::
        map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
        ::end(in_stack_ffffffffffffffa8);
  bVar1 = utils::std::operator==
                    ((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8);
  if (bVar1) {
    local_8 = utils::std::
              map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
              ::at((map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
                    *)this_00._M_node,&(__k._M_node)->_M_color);
  }
  else {
    ppVar2 = utils::std::
             _Rb_tree_iterator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>
                           *)0x279b60);
    local_8 = &ppVar2->second;
  }
  return local_8;
}

Assistant:

Conf_T& unsafeGetConfigByRef(Level level, std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
      }
    }
    return it->second;
  }